

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int __thiscall fmt::v6::detail::count_digits(detail *this,uint128_t n)

{
  int iVar1;
  undefined8 in_RSI;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  
  auVar4._8_8_ = in_RSI;
  auVar4._0_8_ = this;
  iVar1 = 4;
  while( true ) {
    uVar2 = auVar4._8_8_;
    uVar3 = auVar4._0_8_;
    if (uVar2 < (uVar3 < 10)) {
      return iVar1 + -3;
    }
    if (uVar2 == 0 && (ulong)(99 < uVar3) <= -uVar2) {
      return iVar1 + -2;
    }
    if (uVar2 == 0 && (ulong)(999 < uVar3) <= -uVar2) {
      return iVar1 + -1;
    }
    if (uVar2 < (uVar3 < 10000)) break;
    auVar4 = __udivti3();
    iVar1 = iVar1 + 4;
  }
  return iVar1;
}

Assistant:

inline int count_digits(uint128_t n) {
  int count = 1;
  for (;;) {
    // Integer division is slow so do it for a group of four digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    if (n < 10) return count;
    if (n < 100) return count + 1;
    if (n < 1000) return count + 2;
    if (n < 10000) return count + 3;
    n /= 10000U;
    count += 4;
  }
}